

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_tiled_irreg_proc_grid(Integer g_a,Integer *mapc,Integer *nblocks,Integer *proc_grid)

{
  long lVar1;
  C_Integer *pCVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer jsize;
  Integer maplen;
  Integer ichk;
  Integer j;
  Integer i;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  for (local_28 = 0; local_28 < GA[lVar1].ndim; local_28 = local_28 + 1) {
    if (GA[lVar1].dims[local_28] < *(long *)(in_RDX + local_28 * 8)) {
      pnga_error(in_stack_00000150,in_stack_00000148);
    }
  }
  if (GA[lVar1].distr_type != 0) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  GA[lVar1].distr_type = 4;
  local_40 = 0;
  for (local_28 = 0; local_28 < GA[lVar1].ndim; local_28 = local_28 + 1) {
    local_38 = *(long *)(in_RSI + local_40 * 8);
    if ((local_38 < 1) || (GA[lVar1].dims[local_28] + 1 < local_38)) {
      pnga_error(in_stack_00000150,in_stack_00000148);
    }
    for (local_30 = 1; local_40 = local_40 + 1, local_30 < *(long *)(in_RDX + local_28 * 8);
        local_30 = local_30 + 1) {
      if (*(long *)(in_RSI + local_40 * 8) < local_38) {
        pnga_error(in_stack_00000150,in_stack_00000148);
      }
      local_38 = *(long *)(in_RSI + local_40 * 8);
      if ((local_38 < 1) || (GA[lVar1].dims[local_28] + 1 < local_38)) {
        pnga_error(in_stack_00000150,in_stack_00000148);
      }
    }
  }
  local_40 = 0;
  for (local_28 = 0; local_28 < GA[lVar1].ndim; local_28 = local_28 + 1) {
    local_40 = *(long *)(in_RDX + local_28 * 8) + local_40;
    GA[lVar1].num_blocks[local_28] = *(C_Integer *)(in_RDX + local_28 * 8);
    if (*(long *)(in_RCX + local_28 * 8) < 1) {
      pnga_error(in_stack_00000150,in_stack_00000148);
    }
    GA[lVar1].nblock[local_28] = (int)*(undefined8 *)(in_RCX + local_28 * 8);
  }
  pCVar2 = (C_Integer *)malloc((local_40 + 1) * 8);
  GA[lVar1].mapc = pCVar2;
  for (local_28 = 0; local_28 < local_40; local_28 = local_28 + 1) {
    GA[lVar1].mapc[local_28] = *(C_Integer *)(in_RSI + local_28 * 8);
  }
  GA[lVar1].mapc[local_40] = -1;
  GA[lVar1].irreg = 1;
  local_48 = 1;
  for (local_28 = 0; local_28 < GA[lVar1].ndim; local_28 = local_28 + 1) {
    local_48 = GA[lVar1].num_blocks[local_28] * local_48;
  }
  GA[lVar1].block_total = local_48;
  return;
}

Assistant:

void pnga_set_tiled_irreg_proc_grid(Integer g_a, Integer *mapc, Integer *nblocks,
    Integer *proc_grid)
{
  Integer i, j, ichk, maplen, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular tiled data distribution on array"
        " that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set irregular tiled data distribution if array size not set",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblocks[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
  GA[ga_handle].distr_type = TILED_IRREG;
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblocks[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblocks[i];
    GA[ga_handle].num_blocks[i] = (C_Integer)nblocks[i];
    if (proc_grid[i] < 1)
      pnga_error("Processor grid dimensions must all be greater than zero",0);
    GA[ga_handle].nblock[i] = proc_grid[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;

  /* Find total number of blocks */
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}